

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QObject>>::emplace<QPointer<QObject>>
          (QMovableArrayOps<QPointer<QObject>> *this,qsizetype i,QPointer<QObject> *args)

{
  undefined8 *puVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  Data *pDVar5;
  QObject *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = *(int **)this;
  if ((piVar3 != (int *)0x0) && (*piVar3 < 2)) {
    if ((*(long *)(this + 0x10) == i) &&
       (*(long *)(piVar3 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar3 + 0x1fU & 0xfffffffffffffff0)) >> 4) + i)) {
      pQVar6 = (args->wp).value;
      puVar1 = (undefined8 *)(*(long *)(this + 8) + i * 0x10);
      *puVar1 = (args->wp).d;
      puVar1[1] = pQVar6;
      (args->wp).d = (Data *)0x0;
      (args->wp).value = (QObject *)0x0;
      goto LAB_002bcfa5;
    }
    if ((i == 0) &&
       (uVar4 = *(ulong *)(this + 8), ((long)piVar3 + 0x1fU & 0xfffffffffffffff0) != uVar4)) {
      pQVar6 = (args->wp).value;
      *(Data **)(uVar4 - 0x10) = (args->wp).d;
      *(QObject **)(uVar4 - 8) = pQVar6;
      (args->wp).d = (Data *)0x0;
      (args->wp).value = (QObject *)0x0;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
      goto LAB_002bcfa5;
    }
  }
  pDVar5 = (args->wp).d;
  pQVar6 = (args->wp).value;
  (args->wp).d = (Data *)0x0;
  (args->wp).value = (QObject *)0x0;
  lVar7 = *(long *)(this + 0x10);
  QArrayDataPointer<QPointer<QObject>_>::detachAndGrow
            ((QArrayDataPointer<QPointer<QObject>_> *)this,(uint)(i == 0 && lVar7 != 0),1,
             (QPointer<QObject> **)0x0,(QArrayDataPointer<QPointer<QObject>_> *)0x0);
  lVar8 = *(long *)(this + 8);
  if (i == 0 && lVar7 != 0) {
    *(Data **)(lVar8 + -0x10) = pDVar5;
    *(QObject **)(lVar8 + -8) = pQVar6;
    *(long *)(this + 8) = lVar8 + -0x10;
  }
  else {
    puVar1 = (undefined8 *)(lVar8 + i * 0x10);
    memmove(puVar1 + 2,(void *)(lVar8 + i * 0x10),(*(long *)(this + 0x10) - i) * 0x10);
    *puVar1 = pDVar5;
    puVar1[1] = pQVar6;
  }
LAB_002bcfa5:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }